

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cc
# Opt level: O2

void sptk::world::decimate(double *x,int x_length,int r,double *y)

{
  double dVar1;
  uint x_length_00;
  int iVar2;
  double *x_00;
  double *y_00;
  double *pdVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  
  x_length_00 = x_length + 0x12;
  uVar6 = 0xffffffffffffffff;
  if (-0x13 < x_length) {
    uVar6 = (ulong)x_length_00 * 8;
  }
  x_00 = (double *)operator_new__(uVar6);
  y_00 = (double *)operator_new__(uVar6);
  dVar1 = *x;
  pdVar3 = x + 9;
  for (lVar5 = 0; lVar5 != 9; lVar5 = lVar5 + 1) {
    x_00[lVar5] = (dVar1 + dVar1) - *pdVar3;
    pdVar3 = pdVar3 + -1;
  }
  lVar7 = (long)(x_length + 9);
  for (lVar5 = 9; lVar5 < lVar7; lVar5 = lVar5 + 1) {
    x_00[lVar5] = x[lVar5 + -9];
  }
  dVar1 = x[(long)x_length + -1];
  iVar2 = x_length + -2;
  for (lVar5 = lVar7; lVar5 < (int)x_length_00; lVar5 = lVar5 + 1) {
    x_00[lVar5] = (dVar1 + dVar1) - x[iVar2];
    iVar2 = iVar2 + -1;
  }
  anon_unknown_4::FilterForDecimate(x_00,x_length_00,r,y_00);
  uVar4 = 0;
  uVar6 = 0;
  if (0 < (int)x_length_00) {
    uVar6 = (ulong)x_length_00;
  }
  iVar2 = x_length + 0x11;
  for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    x_00[uVar4] = y_00[iVar2];
    iVar2 = iVar2 + -1;
  }
  anon_unknown_4::FilterForDecimate(x_00,x_length_00,r,y_00);
  iVar2 = x_length + 0x11;
  for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    x_00[uVar4] = y_00[iVar2];
    iVar2 = iVar2 + -1;
  }
  for (lVar5 = (long)((x_length + -1) % r + 1); lVar5 < lVar7; lVar5 = lVar5 + r) {
    *y = x_00[lVar5 + 8];
    y = y + 1;
  }
  operator_delete__(x_00);
  operator_delete__(y_00);
  return;
}

Assistant:

void decimate(const double *x, int x_length, int r, double *y) {
  const int kNFact = 9;
  double *tmp1 = new double[x_length + kNFact * 2];
  double *tmp2 = new double[x_length + kNFact * 2];

  for (int i = 0; i < kNFact; ++i) tmp1[i] = 2 * x[0] - x[kNFact - i];
  for (int i = kNFact; i < kNFact + x_length; ++i) tmp1[i] = x[i - kNFact];
  for (int i = kNFact + x_length; i < 2 * kNFact + x_length; ++i)
    tmp1[i] = 2 * x[x_length - 1] - x[x_length - 2 - (i - (kNFact + x_length))];

  FilterForDecimate(tmp1, 2 * kNFact + x_length, r, tmp2);
  for (int i = 0; i < 2 * kNFact + x_length; ++i)
    tmp1[i] = tmp2[2 * kNFact + x_length - i - 1];
  FilterForDecimate(tmp1, 2 * kNFact + x_length, r, tmp2);
  for (int i = 0; i < 2 * kNFact + x_length; ++i)
    tmp1[i] = tmp2[2 * kNFact + x_length - i - 1];

  int nout = (x_length - 1) / r + 1;
  int nbeg = r - r * nout + x_length;

  int count = 0;
  for (int i = nbeg; i < x_length + kNFact; i += r)
    y[count++] = tmp1[i + kNFact - 1];

  delete[] tmp1;
  delete[] tmp2;
}